

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Symbol.hh
# Opt level: O3

void __thiscall
avro::parsing::SimpleParser<avro::parsing::JsonHandler>::assertSize
          (SimpleParser<avro::parsing::JsonHandler> *this,size_t n)

{
  size_t sVar1;
  ostream *poVar2;
  undefined8 *puVar3;
  ostringstream oss;
  string asStack_1b8 [32];
  ostringstream local_198 [376];
  
  sVar1 = popSize(this);
  if (sVar1 == n) {
    return;
  }
  std::__cxx11::ostringstream::ostringstream(local_198);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_198,"Incorrect size. Expected: ",0x1a);
  poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)local_198);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2," found ",7);
  std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
  puVar3 = (undefined8 *)__cxa_allocate_exception(0x18);
  std::__cxx11::stringbuf::str();
  std::runtime_error::runtime_error((runtime_error *)(puVar3 + 1),asStack_1b8);
  *puVar3 = 0x1cc910;
  puVar3[1] = 0x1cc940;
  __cxa_throw(puVar3,&Exception::typeinfo,Exception::~Exception);
}

Assistant:

void assertSize(size_t n) {
        size_t s = popSize();
        if (s != n) {
            std::ostringstream oss;
            oss << "Incorrect size. Expected: " << s << " found " << n;
            throw Exception(oss.str());
        }
    }